

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O0

int Prs_NameIsLegalInVerilog(char *pName,int NameId)

{
  char *pcVar1;
  char *pcStack_18;
  int NameId_local;
  char *pName_local;
  
  if ((pName != (char *)0x0) && (*pName != '\0')) {
    if (*pName == '\\') {
      pName_local._4_4_ = 1;
    }
    else if (NameId < 0xd) {
      pName_local._4_4_ = 0;
    }
    else if ((((*pName < 'a') || (pcStack_18 = pName, 'z' < *pName)) &&
             ((*pName < 'A' || (pcStack_18 = pName, 'Z' < *pName)))) &&
            (pcStack_18 = pName, *pName != '_')) {
      pName_local._4_4_ = 0;
    }
    else {
      do {
        pcVar1 = pcStack_18 + 1;
        if (pcStack_18[1] == '\0') {
          return 1;
        }
        pcStack_18 = pcVar1;
      } while (((('`' < *pcVar1) && (*pcVar1 < '{')) || (('@' < *pcVar1 && (*pcVar1 < '[')))) ||
              (((('/' < *pcVar1 && (*pcVar1 < ':')) || (*pcVar1 == '_')) || (*pcVar1 == '$'))));
      pName_local._4_4_ = 0;
    }
    return pName_local._4_4_;
  }
  __assert_fail("pName != NULL && *pName != \'\\0\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaWriteVer.c"
                ,0x8b,"int Prs_NameIsLegalInVerilog(char *, int)");
}

Assistant:

static inline int Prs_NameIsLegalInVerilog( char * pName, int NameId )
{
    // identifier ::= simple_identifier | escaped_identifier
    // simple_identifier ::= [a-zA-Z_][a-zA-Z0-9_$]
    // escaped_identifier ::= \ {Any_ASCII_character_except_white_space} white_space
    // white_space ::= space | tab | newline
    assert( pName != NULL && *pName != '\0' );
    if ( *pName == '\\' )
        return 1;
    if ( NameId < 13 ) // see PRS_VER_UNKNOWN in cbaReadVer.c
        return 0;
    if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && *pName != '_' )
        return 0;
    while ( *(++pName) )
        if ( (*pName < 'a' || *pName > 'z') && (*pName < 'A' || *pName > 'Z') && (*pName < '0' || *pName > '9') && *pName != '_' && *pName != '$' ) 
            return 0;
    return 1;
}